

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O1

void __thiscall
glslang::HlslParseContext::assignToInterface(HlslParseContext *this,TVariable *variable)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  mapped_type *pmVar4;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  pointer ppTVar7;
  anon_class_8_1_8991fb9c assignLocation;
  anon_class_8_1_8991fb9c local_28;
  key_type_conflict2 local_20;
  long lVar3;
  
  local_28.this = this;
  iVar2 = (*(variable->super_TSymbol)._vptr_TSymbol[0xf])(variable);
  lVar3 = CONCAT44(extraout_var,iVar2);
  p_Var1 = &(this->flattenMap).
            super_map<long_long,_glslang::HlslParseContext::TFlattenData,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_>_>
            ._M_t._M_impl.super__Rb_tree_header;
  p_Var6 = (this->flattenMap).
           super_map<long_long,_glslang::HlslParseContext::TFlattenData,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_>_>
           ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var5 = &p_Var1->_M_header;
  for (; p_Var6 != (_Base_ptr)0x0; p_Var6 = (&p_Var6->_M_left)[*(long *)(p_Var6 + 1) < lVar3]) {
    if (lVar3 <= *(long *)(p_Var6 + 1)) {
      p_Var5 = p_Var6;
    }
  }
  p_Var6 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var5 != p_Var1) && (p_Var6 = p_Var5, lVar3 < *(long *)(p_Var5 + 1))) {
    p_Var6 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var6 == p_Var1) {
    iVar2 = (*(variable->super_TSymbol)._vptr_TSymbol[0xf])(variable);
    lVar3 = CONCAT44(extraout_var_01,iVar2);
    p_Var1 = &(this->splitNonIoVars).
              super_map<long_long,_glslang::TVariable_*,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::TVariable_*>_>_>
              ._M_t._M_impl.super__Rb_tree_header;
    p_Var6 = (this->splitNonIoVars).
             super_map<long_long,_glslang::TVariable_*,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::TVariable_*>_>_>
             ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var5 = &p_Var1->_M_header;
    for (; p_Var6 != (_Base_ptr)0x0; p_Var6 = (&p_Var6->_M_left)[*(long *)(p_Var6 + 1) < lVar3]) {
      if (lVar3 <= *(long *)(p_Var6 + 1)) {
        p_Var5 = p_Var6;
      }
    }
    p_Var6 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var5 != p_Var1) && (p_Var6 = p_Var5, lVar3 < *(long *)(p_Var5 + 1))) {
      p_Var6 = &p_Var1->_M_header;
    }
    if ((_Rb_tree_header *)p_Var6 != p_Var1) {
      iVar2 = (*(variable->super_TSymbol)._vptr_TSymbol[0xf])(variable);
      variable = getSplitNonIoVar(this,CONCAT44(extraout_var_02,iVar2));
    }
    assignToInterface::anon_class_8_1_8991fb9c::operator()(&local_28,variable);
  }
  else {
    iVar2 = (*(variable->super_TSymbol)._vptr_TSymbol[0xf])(variable);
    local_20 = CONCAT44(extraout_var_00,iVar2);
    pmVar4 = std::
             map<long_long,_glslang::HlslParseContext::TFlattenData,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_>_>
             ::operator[](&(this->flattenMap).
                           super_map<long_long,_glslang::HlslParseContext::TFlattenData,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_>_>
                          ,&local_20);
    ppTVar7 = (pmVar4->members).
              super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
              super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (ppTVar7 !=
        (pmVar4->members).
        super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
        super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      do {
        assignToInterface::anon_class_8_1_8991fb9c::operator()(&local_28,*ppTVar7);
        ppTVar7 = ppTVar7 + 1;
      } while (ppTVar7 !=
               (pmVar4->members).
               super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
               super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  return;
}

Assistant:

void HlslParseContext::assignToInterface(TVariable& variable)
{
    const auto assignLocation = [&](TVariable& variable) {
        TType& type = variable.getWritableType();
        if (!type.isStruct() || type.getStruct()->size() > 0) {
            TQualifier& qualifier = type.getQualifier();
            if (qualifier.storage == EvqVaryingIn || qualifier.storage == EvqVaryingOut) {
                if (qualifier.builtIn == EbvNone && !qualifier.hasLocation()) {
                    // Strip off the outer array dimension for those having an extra one.
                    int size;
                    if (type.isArray() && qualifier.isArrayedIo(language)) {
                        TType elementType(type, 0);
                        size = intermediate.computeTypeLocationSize(elementType, language);
                    } else
                        size = intermediate.computeTypeLocationSize(type, language);

                    if (qualifier.storage == EvqVaryingIn) {
                        variable.getWritableType().getQualifier().layoutLocation = nextInLocation;
                        nextInLocation += size;
                    } else {
                        variable.getWritableType().getQualifier().layoutLocation = nextOutLocation;
                        nextOutLocation += size;
                    }
                }
                trackLinkage(variable);
            }
        }
    };

    if (wasFlattened(variable.getUniqueId())) {
        auto& memberList = flattenMap[variable.getUniqueId()].members;
        for (auto member = memberList.begin(); member != memberList.end(); ++member)
            assignLocation(**member);
    } else if (wasSplit(variable.getUniqueId())) {
        TVariable* splitIoVar = getSplitNonIoVar(variable.getUniqueId());
        assignLocation(*splitIoVar);
    } else {
        assignLocation(variable);
    }
}